

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m6502.h
# Opt level: O0

uint8_t __thiscall m6502::JSR(m6502 *this)

{
  int iVar1;
  undefined6 in_register_0000000a;
  m6502 *this_local;
  
  this->pc = this->pc - 1;
  iVar1 = this->stackPointer + 0x100;
  write(this,iVar1,(void *)(ulong)(uint)((int)(uint)this->pc >> 8),
        CONCAT62(in_register_0000000a,(short)iVar1));
  this->stackPointer = this->stackPointer + 0xff;
  iVar1 = this->stackPointer + 0x100;
  write(this,iVar1,(void *)(ulong)(byte)this->pc,CONCAT62(in_register_0000000a,(short)iVar1));
  this->stackPointer = this->stackPointer + 0xff;
  this->pc = this->addrAbs;
  return '\0';
}

Assistant:

uint8_t JSR()
  {
    --pc;
    write(0x0100u + stackPointer, (pc >> 8) & 0x00FFu);
    --stackPointer;
    write(0x0100u + stackPointer, pc & 0x00FFu);
    --stackPointer;
    pc = addrAbs;
    return 0;
  }